

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

Datatype * __thiscall
TypeOpIntLess::getInputCast(TypeOpIntLess *this,PcodeOp *op,int4 slot,CastStrategy *castStrategy)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  HighVariable *this_00;
  undefined4 extraout_var_00;
  
  iVar1 = (*op->opcode->_vptr_TypeOp[6])();
  iVar2 = (*castStrategy->_vptr_CastStrategy[4])(castStrategy,op,(ulong)(uint)slot);
  if ((char)iVar2 != '\0') {
    return (Datatype *)CONCAT44(extraout_var,iVar1);
  }
  this_00 = Varnode::getHigh((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[slot]);
  HighVariable::updateType(this_00);
  iVar1 = (*castStrategy->_vptr_CastStrategy[6])
                    (castStrategy,(Datatype *)CONCAT44(extraout_var,iVar1),this_00->type,1,0);
  return (Datatype *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

Datatype *TypeOpIntLess::getInputCast(const PcodeOp *op,int4 slot,const CastStrategy *castStrategy) const

{
  Datatype *reqtype = op->inputTypeLocal(slot);
  if (castStrategy->checkIntPromotionForCompare(op,slot))
    return reqtype;
  Datatype *curtype = op->getIn(slot)->getHigh()->getType();
  return castStrategy->castStandard(reqtype,curtype,true,false);
}